

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

void __thiscall wasm::DataFlow::Trace::findExternalUses(Trace *this)

{
  unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
  *puVar1;
  pointer ppNVar2;
  Expression *pEVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  Expression *pEVar7;
  Node **node;
  pointer ppNVar8;
  undefined1 local_d0 [8];
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  origins;
  __hashtable *__h;
  size_type sStack_80;
  __node_base local_78;
  size_type sStack_70;
  _Prime_rehash_policy local_68;
  __node_base_ptr local_58;
  key_type local_50;
  Expression *use;
  Expression *origin;
  pointer local_38;
  
  local_d0 = (undefined1  [8])&origins._M_h._M_rehash_policy._M_next_resize;
  origins._M_h._M_buckets = (__buckets_ptr)0x1;
  origins._M_h._M_bucket_count = 0;
  origins._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  origins._M_h._M_element_count._0_4_ = 0x3f800000;
  origins._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  origins._M_h._M_rehash_policy._4_4_ = 0;
  origins._M_h._M_rehash_policy._M_next_resize = 0;
  ppNVar8 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar2 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar8 != ppNVar2) {
    do {
      use = (*ppNVar8)->origin;
      if (use != (Expression *)0x0) {
        iVar4 = debug();
        if (1 < iVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"note origin ",0xc);
          poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
          __h = (__hashtable *)CONCAT71(__h._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&__h,1);
        }
        __h = (__hashtable *)local_d0;
        std::
        _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                  ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_d0,&use,&__h);
      }
      ppNVar8 = ppNVar8 + 1;
    } while (ppNVar8 != ppNVar2);
  }
  ppNVar8 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar2 = (this->nodes).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar8 != ppNVar2) {
    puVar1 = &this->hasExternalUses;
    origins._M_h._M_single_bucket = (__node_base_ptr)this;
    do {
      if ((*ppNVar8 != this->toInfer) && (pEVar3 = (*ppNVar8)->origin, pEVar3 != (Expression *)0x0))
      {
        __h = (__hashtable *)&local_58;
        sStack_80 = 1;
        local_78._M_nxt = (_Hash_node_base *)0x0;
        sStack_70 = 0;
        local_68._M_max_load_factor = 1.0;
        local_68._4_4_ = 0;
        local_68._M_next_resize = 0;
        local_58 = (__node_base_ptr)0x0;
        UseFinder::getUses((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&use,
                           (UseFinder *)&__h,pEVar3,this->graph,this->localGraph);
        std::
        _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&__h);
        pEVar3 = origin;
        for (pEVar7 = use; pEVar7 != pEVar3; pEVar7 = (Expression *)&pEVar7->type) {
          local_50 = *(key_type *)pEVar7;
          if ((local_50 == (key_type)0x0) ||
             (sVar6 = std::
                      _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::count((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)local_d0,&local_50), sVar6 == 0)) {
            iVar4 = debug();
            if (1 < iVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"found external use for\n",0x17);
              DataFlow::dump(*ppNVar8,(ostream *)&std::cout,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  due to ",9);
              poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
              __h = (__hashtable *)CONCAT71(__h._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&__h,1);
            }
            __h = &puVar1->_M_h;
            std::
            _Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::DataFlow::Node*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::DataFlow::Node*,false>>>>
                      ((_Hashtable<wasm::DataFlow::Node*,wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>,std::__detail::_Identity,std::equal_to<wasm::DataFlow::Node*>,std::hash<wasm::DataFlow::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)puVar1,ppNVar8,
                       (_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&__h);
            break;
          }
        }
        this = (Trace *)origins._M_h._M_single_bucket;
        if (use != (Expression *)0x0) {
          operator_delete(use,(long)local_38 - (long)use);
          this = (Trace *)origins._M_h._M_single_bucket;
        }
      }
      ppNVar8 = ppNVar8 + 1;
    } while (ppNVar8 != ppNVar2);
  }
  std::
  _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d0);
  return;
}

Assistant:

void findExternalUses() {
    // Find all the wasm code represented in this trace.
    std::unordered_set<Expression*> origins;
    for (auto& node : nodes) {
      if (auto* origin = node->origin) {
        if (debug() >= 2) {
          std::cout << "note origin " << origin << '\n';
        }
        origins.insert(origin);
      }
    }
    for (auto& node : nodes) {
      if (node == toInfer) {
        continue;
      }
      if (auto* origin = node->origin) {
        auto uses = UseFinder().getUses(origin, graph, localGraph);
        for (auto* use : uses) {
          // A non-set use (a drop or return etc.) is definitely external.
          // Otherwise, check if internal or external.
          if (use == nullptr || origins.count(use) == 0) {
            if (debug() >= 2) {
              std::cout << "found external use for\n";
              dump(node, std::cout);
              std::cout << "  due to " << use << '\n';
            }
            hasExternalUses.insert(node);
            break;
          }
        }
      }
    }
  }